

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQNativeClosure::Mark(SQNativeClosure *this,SQCollectable **chain)

{
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQUnsignedInteger i;
  SQCollectable_conflict **in_stack_ffffffffffffffd8;
  SQSharedState *local_18;
  
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    (in_RDI->super_SQRefCounted)._uiRef = (in_RDI->super_SQRefCounted)._uiRef | 0x80000000;
    for (local_18 = (SQSharedState *)0x0; local_18 < in_RDI[1]._sharedstate;
        local_18 = (SQSharedState *)((long)&local_18->_metamethods + 1)) {
      SQSharedState::MarkObject((SQObjectPtr *)in_RDI,in_stack_ffffffffffffffd8);
    }
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQNativeClosure::Mark(SQCollectable **chain)
{
    START_MARK()
        for(SQUnsignedInteger i = 0; i < _noutervalues; i++) SQSharedState::MarkObject(_outervalues[i], chain);
    END_MARK()
}